

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cutil.c
# Opt level: O0

void cCreate_Dense_Matrix
               (SuperMatrix *X,int m,int n,singlecomplex *x,int ldx,Stype_t stype,Dtype_t dtype,
               Mtype_t mtype)

{
  int *piVar1;
  void *pvVar2;
  char local_138 [8];
  char msg [256];
  DNformat *Xstore;
  Stype_t stype_local;
  int ldx_local;
  singlecomplex *x_local;
  int n_local;
  int m_local;
  SuperMatrix *X_local;
  
  X->Stype = stype;
  X->Dtype = dtype;
  X->Mtype = mtype;
  X->nrow = m;
  X->ncol = n;
  pvVar2 = superlu_malloc(0x10);
  X->Store = pvVar2;
  if (X->Store == (void *)0x0) {
    sprintf(local_138,"%s at line %d in file %s\n","SUPERLU_MALLOC fails for X->Store",0x72,
            "/workspace/llm4binary/github/license_c_cmakelists/xiaoyeli[P]superlu/SRC/cutil.c");
    superlu_abort_and_exit(local_138);
  }
  piVar1 = (int *)X->Store;
  *piVar1 = ldx;
  *(singlecomplex **)(piVar1 + 2) = x;
  return;
}

Assistant:

void
cCreate_Dense_Matrix(SuperMatrix *X, int m, int n, singlecomplex *x, int ldx,
		    Stype_t stype, Dtype_t dtype, Mtype_t mtype)
{
    DNformat    *Xstore;
    
    X->Stype = stype;
    X->Dtype = dtype;
    X->Mtype = mtype;
    X->nrow = m;
    X->ncol = n;
    X->Store = (void *) SUPERLU_MALLOC( sizeof(DNformat) );
    if ( !(X->Store) ) ABORT("SUPERLU_MALLOC fails for X->Store");
    Xstore = (DNformat *) X->Store;
    Xstore->lda = ldx;
    Xstore->nzval = (singlecomplex *) x;
}